

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O1

void __thiscall Scs::Server::SendAll(Server *this,void *data,size_t bytes)

{
  ClientConnectionList *pCVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  BufferPtr buffer;
  vector<unsigned_char,Scs::Allocator<unsigned_char>> *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_connectionListMutex);
  if (iVar4 == 0) {
    pCVar1 = &this->m_connectionList;
    if ((this->m_connectionList).
        super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pCVar1) {
      CreateBuffer();
      std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                (local_40,*(undefined8 *)(local_40 + 8),data,(long)data + bytes);
      for (p_Var2 = (pCVar1->
                    super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next;
          p_Var2 != (_List_node_base *)pCVar1; p_Var2 = p_Var2->_M_next) {
        p_Var3 = p_Var2[1]._M_next;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[1]._M_prev;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        SendQueue::Push((SendQueue *)((long)(p_Var3 + 2) + 8),data,bytes);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_connectionListMutex);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void Server::SendAll(const void * data, size_t bytes)
{
	std::lock_guard<std::mutex> lock(m_connectionListMutex);
	if (m_connectionList.empty())
		return;
	BufferPtr buffer = CreateBuffer();
	buffer->insert(buffer->end(), static_cast<const uint8_t *>(data), static_cast<const uint8_t *>(data) + bytes);
	for (auto connection : m_connectionList)
		connection->sendQueue.Push(data, bytes);
}